

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCore.c
# Opt level: O0

void Fra_FraigSweep(Fra_Man_t *p)

{
  Aig_Man_t *p_00;
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *p1;
  int local_28;
  int nBTracksOld;
  int Pos;
  int i;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pObj;
  Fra_Man_t *p_local;
  
  local_28 = 0;
  iVar1 = Aig_ManCiNum(p->pManAig);
  iVar2 = Aig_ManRegNum(p->pManAig);
  for (nBTracksOld = iVar1 - iVar2; iVar1 = Vec_PtrSize(p->pManAig->vCis), nBTracksOld < iVar1;
      nBTracksOld = nBTracksOld + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->pManAig->vCis,nBTracksOld);
    Fra_FraigNode(p,pAVar3);
    if (p->pPars->fUseImps != 0) {
      local_28 = Fra_ImpCheckForNode(p,p->pCla->vImps,pAVar3,local_28);
    }
  }
  if (p->pPars->fLatchCorr == 0) {
    iVar1 = p->pPars->nBTLimitNode;
    for (nBTracksOld = 0; iVar2 = Vec_PtrSize(p->pManAig->vObjs), nBTracksOld < iVar2;
        nBTracksOld = nBTracksOld + 1) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->pManAig->vObjs,nBTracksOld);
      if ((pAVar3 != (Aig_Obj_t *)0x0) && (iVar2 = Aig_ObjIsNode(pAVar3), iVar2 != 0)) {
        p_00 = p->pManFraig;
        pAVar4 = Fra_ObjChild0Fra(pAVar3,p->pPars->nFramesK);
        p1 = Fra_ObjChild1Fra(pAVar3,p->pPars->nFramesK);
        pAVar4 = Aig_And(p_00,pAVar4,p1);
        Fra_ObjSetFraig(pAVar3,p->pPars->nFramesK,pAVar4);
        pAVar4 = Aig_Regular(pAVar4);
        (pAVar4->field_5).pData = p;
        if (p->pManFraig->pData == (void *)0x0) {
          if ((p->pPars->nLevelMax != 0) &&
             (p->pPars->nLevelMax <
              (int)((uint)((ulong)*(undefined8 *)&pAVar3->field_0x18 >> 0x20) & 0xffffff))) {
            p->pPars->nBTLimitNode = 5;
          }
          Fra_FraigNode(p,pAVar3);
          if ((p->pPars->nLevelMax != 0) &&
             (p->pPars->nLevelMax <
              (int)((uint)((ulong)*(undefined8 *)&pAVar3->field_0x18 >> 0x20) & 0xffffff))) {
            p->pPars->nBTLimitNode = iVar1;
          }
          if (p->pPars->fUseImps != 0) {
            local_28 = Fra_ImpCheckForNode(p,p->pCla->vImps,pAVar3,local_28);
          }
        }
      }
    }
    iVar1 = Aig_ManNodeNum(p->pManFraig);
    p->nNodesMiter = iVar1;
    if (p->pPars->fUseImps != 0) {
      Fra_ImpCompactArray(p->pCla->vImps);
    }
  }
  return;
}

Assistant:

void Fra_FraigSweep( Fra_Man_t * p )
{
//    Bar_Progress_t * pProgress = NULL;
    Aig_Obj_t * pObj, * pObjNew;
    int i, Pos = 0;
    int nBTracksOld;
    // fraig latch outputs
    Aig_ManForEachLoSeq( p->pManAig, pObj, i )
    {
        Fra_FraigNode( p, pObj );
        if ( p->pPars->fUseImps )
            Pos = Fra_ImpCheckForNode( p, p->pCla->vImps, pObj, Pos );
    }
    if ( p->pPars->fLatchCorr )
        return;
    // fraig internal nodes
//    if ( !p->pPars->fDontShowBar )
//        pProgress = Bar_ProgressStart( stdout, Aig_ManObjNumMax(p->pManAig) );
    nBTracksOld = p->pPars->nBTLimitNode;
    Aig_ManForEachNode( p->pManAig, pObj, i )
    {
//        if ( pProgress )
//            Bar_ProgressUpdate( pProgress, i, NULL );
        // derive and remember the new fraig node
        pObjNew = Aig_And( p->pManFraig, Fra_ObjChild0Fra(pObj,p->pPars->nFramesK), Fra_ObjChild1Fra(pObj,p->pPars->nFramesK) );
        Fra_ObjSetFraig( pObj, p->pPars->nFramesK, pObjNew );
        Aig_Regular(pObjNew)->pData = p;
        // quit if simulation detected a counter-example for a PO
        if ( p->pManFraig->pData )
            continue;
//        if ( Aig_SupportSize(p->pManAig,pObj) > 16 )
//            continue;
        // perform fraiging
        if ( p->pPars->nLevelMax && (int)pObj->Level > p->pPars->nLevelMax )
            p->pPars->nBTLimitNode = 5;
        Fra_FraigNode( p, pObj );
        if ( p->pPars->nLevelMax && (int)pObj->Level > p->pPars->nLevelMax )
            p->pPars->nBTLimitNode = nBTracksOld;
        // check implications
        if ( p->pPars->fUseImps )
            Pos = Fra_ImpCheckForNode( p, p->pCla->vImps, pObj, Pos );
    }
//    if ( pProgress )
//        Bar_ProgressStop( pProgress );
    // try to prove the outputs of the miter
    p->nNodesMiter = Aig_ManNodeNum(p->pManFraig);
//    Fra_MiterStatus( p->pManFraig );
//    if ( p->pPars->fProve && p->pManFraig->pData == NULL )
//        Fra_MiterProve( p );
    // compress implications after processing all of them
    if ( p->pPars->fUseImps )
        Fra_ImpCompactArray( p->pCla->vImps );
}